

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O2

void Qentem::Memory::
     Sort<false,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>,unsigned_int>
               (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *arr,uint start,uint end)

{
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar1;
  bool bVar2;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *item2;
  uint uVar3;
  uint end_00;
  ulong uVar4;
  
LAB_0010b270:
  if (start == end) {
    return;
  }
  uVar4 = (ulong)start;
  uVar3 = start;
  do {
    pHVar1 = arr + (uVar3 + 1);
    do {
      item2 = pHVar1;
      uVar3 = uVar3 + 1;
      end_00 = (uint)uVar4;
      if (end <= uVar3) {
        if (end_00 != start) {
          Swap<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>(arr + uVar4,arr + start);
        }
        Sort<false,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>,unsigned_int>
                  (arr,start,end_00);
        start = end_00 + 1;
        goto LAB_0010b270;
      }
      bVar2 = String<char>::operator>(&item2->Key,&arr[start].Key);
      pHVar1 = item2 + 1;
    } while (!bVar2);
    uVar4 = (ulong)(end_00 + 1);
    Swap<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>(arr + uVar4,item2);
  } while( true );
}

Assistant:

inline static void Sort(Type_T *arr, Number_T start, Number_T end) noexcept {
    if (start != end) {
        Type_T  &item   = arr[start];
        Number_T index  = start;
        Number_T offset = (start + Number_T{1});

        while (offset < end) {
            if (Ascend_T) {
                if (arr[offset] < item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            } else {
                if (arr[offset] > item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            }

            ++offset;
        }

        if (index != start) {
            Swap(arr[index], arr[start]);
        }

        Sort<Ascend_T>(arr, start, index);
        ++index;
        Sort<Ascend_T>(arr, index, end);
    }
}